

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_iterator.cpp
# Opt level: O2

void __thiscall
duckdb::TupleDataChunkIterator::TupleDataChunkIterator
          (TupleDataChunkIterator *this,TupleDataCollection *collection_p,
          TupleDataPinProperties properties,idx_t chunk_idx_from,idx_t chunk_idx_to,bool init_heap_p
          )

{
  pointer pTVar1;
  pointer pTVar2;
  ulong uVar3;
  pointer *ppTVar4;
  ulong uVar5;
  idx_t iVar6;
  
  this->collection = collection_p;
  this->init_heap = init_heap_p;
  TupleDataScanState::TupleDataScanState(&this->state);
  (this->state).pin_state.properties = properties;
  pTVar1 = (this->collection->segments).
           super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
           super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->collection->segments).
           super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
           super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppTVar4 = (pointer *)((long)&pTVar1->chunks + 8);
  uVar3 = 0;
  for (uVar5 = 0; uVar5 < (ulong)(((long)pTVar2 - (long)pTVar1) / 0xb0); uVar5 = uVar5 + 1) {
    if ((uVar3 <= chunk_idx_from) &&
       (chunk_idx_from <=
        ((long)*ppTVar4 - (long)((_Vector_impl_data *)(ppTVar4 + -1))->_M_start) / 0x28 + uVar3)) {
      this->start_segment_idx = uVar5;
      this->start_chunk_idx = chunk_idx_from - uVar3;
    }
    iVar6 = chunk_idx_to - uVar3;
    if (chunk_idx_to < uVar3) {
      uVar3 = ((long)*ppTVar4 - (long)((_Vector_impl_data *)(ppTVar4 + -1))->_M_start) / 0x28 +
              uVar3;
    }
    else {
      uVar3 = ((long)*ppTVar4 - (long)((_Vector_impl_data *)(ppTVar4 + -1))->_M_start) / 0x28 +
              uVar3;
      if (chunk_idx_to <= uVar3) {
        this->end_segment_idx = uVar5;
        this->end_chunk_idx = iVar6;
      }
    }
    ppTVar4 = ppTVar4 + 0x16;
  }
  Reset(this);
  return;
}

Assistant:

TupleDataChunkIterator::TupleDataChunkIterator(TupleDataCollection &collection_p, TupleDataPinProperties properties,
                                               idx_t chunk_idx_from, idx_t chunk_idx_to, bool init_heap_p)
    : collection(collection_p), init_heap(init_heap_p) {
	state.pin_state.properties = properties;
	D_ASSERT(chunk_idx_from < chunk_idx_to);
	D_ASSERT(chunk_idx_to <= collection.ChunkCount());
	idx_t overall_chunk_index = 0;
	for (idx_t segment_idx = 0; segment_idx < collection.segments.size(); segment_idx++) {
		const auto &segment = collection.segments[segment_idx];
		if (chunk_idx_from >= overall_chunk_index && chunk_idx_from <= overall_chunk_index + segment.ChunkCount()) {
			// We start in this segment
			start_segment_idx = segment_idx;
			start_chunk_idx = chunk_idx_from - overall_chunk_index;
		}
		if (chunk_idx_to >= overall_chunk_index && chunk_idx_to <= overall_chunk_index + segment.ChunkCount()) {
			// We end in this segment
			end_segment_idx = segment_idx;
			end_chunk_idx = chunk_idx_to - overall_chunk_index;
		}
		overall_chunk_index += segment.ChunkCount();
	}

	Reset();
}